

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

void __thiscall
mjs::error_object::error_object
          (error_object *this,native_error_type type,string *class_name,object_ptr *prototype,
          string *stack_trace)

{
  value vStack_58;
  
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_0023f980;
  *(native_error_type *)&(this->super_native_object).field_0x24 = type;
  value::value(&vStack_58,class_name);
  value_representation::value_representation(&this->name_,&vStack_58);
  value::~value(&vStack_58);
  (this->stack_trace_).pos_ =
       (stack_trace->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  native_object::
  add_native_property<mjs::error_object,_&mjs::error_object::get_name,_&mjs::error_object::put_name>
            (&this->super_native_object,"name",dont_delete|dont_enum);
  return;
}

Assistant:

explicit error_object(native_error_type type, const string& class_name, const object_ptr& prototype, const string& stack_trace)
        : native_object{class_name, prototype}
        , type_(type)
        , name_(value_representation{value{class_name}})
        , stack_trace_(stack_trace.unsafe_raw_get()) {
        DEFINE_NATIVE_PROPERTY(error_object, name);
    }